

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::GetTargetTypeFromString(cmFileInstaller *this,string *stype)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  ostringstream local_190 [376];
  
  bVar1 = std::operator==(stype,"EXECUTABLE");
  if (bVar1) {
    *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 0;
  }
  else {
    bVar1 = std::operator==(stype,"FILE");
    if (bVar1) {
      *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 4;
    }
    else {
      bVar1 = std::operator==(stype,"PROGRAM");
      if (bVar1) {
        *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 5;
      }
      else {
        bVar1 = std::operator==(stype,"STATIC_LIBRARY");
        if (bVar1) {
          *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 1;
        }
        else {
          bVar1 = std::operator==(stype,"SHARED_LIBRARY");
          if (bVar1) {
            *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 2;
          }
          else {
            bVar1 = std::operator==(stype,"MODULE");
            if (bVar1) {
              *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 3;
            }
            else {
              bVar1 = std::operator==(stype,"DIRECTORY");
              if (!bVar1) {
                std::__cxx11::ostringstream::ostringstream(local_190);
                poVar2 = std::operator<<((ostream *)local_190,"Option TYPE given unknown value \"");
                poVar2 = std::operator<<(poVar2,(string *)stype);
                std::operator<<(poVar2,"\".");
                this_00 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(this_00,&local_1b0);
                std::__cxx11::string::~string((string *)&local_1b0);
                std::__cxx11::ostringstream::~ostringstream(local_190);
                return false;
              }
              *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 6;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileInstaller
::GetTargetTypeFromString(const std::string& stype)
{
  if ( stype == "EXECUTABLE" )
    {
    this->InstallType = cmInstallType_EXECUTABLE;
    }
  else if ( stype == "FILE" )
    {
    this->InstallType = cmInstallType_FILES;
    }
  else if ( stype == "PROGRAM" )
    {
    this->InstallType = cmInstallType_PROGRAMS;
    }
  else if ( stype == "STATIC_LIBRARY" )
    {
    this->InstallType = cmInstallType_STATIC_LIBRARY;
    }
  else if ( stype == "SHARED_LIBRARY" )
    {
    this->InstallType = cmInstallType_SHARED_LIBRARY;
    }
  else if ( stype == "MODULE" )
    {
    this->InstallType = cmInstallType_MODULE_LIBRARY;
    }
  else if ( stype == "DIRECTORY" )
    {
    this->InstallType = cmInstallType_DIRECTORY;
    }
  else
    {
    std::ostringstream e;
    e << "Option TYPE given unknown value \"" << stype << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }
  return true;
}